

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O0

trade_sign helix::nasdaq::itch_trade_sign(side_type s)

{
  invalid_argument *this;
  char in_DIL;
  allocator local_29;
  string local_28 [36];
  trade_sign local_4;
  
  if (in_DIL == '\x01') {
    local_4 = seller_initiated;
  }
  else {
    if (in_DIL != '\x02') {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_28,"invalid argument",&local_29);
      std::invalid_argument::invalid_argument(this,local_28);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    local_4 = buyer_initiated;
  }
  return local_4;
}

Assistant:

trade_sign itch_trade_sign(side_type s)
{
    switch (s) {
    case side_type::buy:  return trade_sign::seller_initiated;
    case side_type::sell: return trade_sign::buyer_initiated;
    default:              throw invalid_argument(string("invalid argument"));
    }
}